

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O1

real cnn::rand_normal(void)

{
  result_type_conflict2 rVar1;
  normal_distribution<float> local_10;
  
  local_10._M_param._M_mean = 0.0;
  local_10._M_param._M_stddev = 1.0;
  local_10._M_saved = 0.0;
  local_10._M_saved_available = false;
  rVar1 = std::normal_distribution<float>::operator()(&local_10,rndeng,&local_10._M_param);
  return rVar1;
}

Assistant:

real rand_normal() {
  normal_distribution<real> distribution(0, 1);
  return distribution(*rndeng);
}